

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O3

uint64_t bitset_flip_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort uVar1;
  long lVar2;
  
  if (length != 0) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)((long)list + lVar2);
      card = (card - ((int)(words[uVar1 >> 6] >> ((byte)uVar1 & 0x3f)) * 2 & 2)) + 1;
      words[uVar1 >> 6] = words[uVar1 >> 6] ^ 1L << ((ulong)uVar1 & 0x3f);
      lVar2 = lVar2 + 2;
    } while (length * 2 != lVar2);
  }
  return card;
}

Assistant:

uint64_t bitset_flip_list_withcard(uint64_t *words, uint64_t card,
                                   const uint16_t *list, uint64_t length) {
    uint64_t offset, load, newload, pos, index;
    const uint16_t *end = list + length;
    while (list != end) {
        pos = *list;
        offset = pos >> 6;
        index = pos % 64;
        load = words[offset];
        newload = load ^ (UINT64_C(1) << index);
        // todo: is a branch here all that bad?
        card +=
            (1 - 2 * (((UINT64_C(1) << index) & load) >> index));  // +1 or -1
        words[offset] = newload;
        list++;
    }
    return card;
}